

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::DataCollectionStart(AmpIO *this,uchar chan,CollectCallback collectCB)

{
  uint32_t uVar1;
  ostream *this_00;
  CollectCallback collectCB_local;
  uchar chan_local;
  AmpIO *this_local;
  
  uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar1 < 7) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar1 == 0x44514c41) {
      this_00 = std::operator<<((ostream *)&std::cerr,
                                "AmpIO::DataCollectionStart not implemented for DQLA");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    else if ((chan == '\0') || (this->NumMotors < (uint)chan)) {
      this_local._7_1_ = false;
    }
    else {
      this->collect_state = true;
      this->collect_chan = chan;
      this->collect_rindex = 0;
      this->collect_cb = collectCB;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::DataCollectionStart(unsigned char chan, CollectCallback collectCB)
{
    if (GetFirmwareVersion() < 7) return false;
    if (GetHardwareVersion() == DQLA_String) {
        std::cerr << "AmpIO::DataCollectionStart not implemented for DQLA" << std::endl;
        return false;
    }
    if ((chan < 1) || (chan > NumMotors)) return false;
    collect_state = true;
    collect_chan = chan;
    collect_rindex = 0;
    collect_cb = collectCB;
    return true;
}